

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  ushort uVar2;
  Parse *pParse;
  Select *pSVar3;
  SrcList *pSVar4;
  IdList *pIVar5;
  Upsert *pUVar6;
  sqlite3 *psVar7;
  Db *pDVar8;
  u8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  FuncDef *pFVar14;
  NameContext *pNC;
  Window *pWVar15;
  Window *pWVar16;
  ExprList *pEVar17;
  Expr *pEVar18;
  byte bVar19;
  long lVar20;
  long lVar21;
  Expr *pFrom;
  char *pcVar22;
  uint uVar23;
  Table *pTVar24;
  Schema *pSVar25;
  Table **ppTVar26;
  NameContext *pNVar27;
  ulong uVar28;
  char **ppcVar29;
  Table **ppTVar30;
  char *pcVar31;
  char *zLeft;
  Column *pCVar32;
  ulong uVar33;
  uint uVar34;
  Schema *pSVar35;
  uint uVar36;
  char *pcVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  u8 local_109;
  char *local_100;
  SrcList_item *local_e0;
  SrcList_item *local_d0;
  uint local_c8;
  NameContext *local_b8;
  sqlite3 *local_b0;
  int *local_a8;
  int local_a0;
  SrcList *local_70;
  undefined8 local_68;
  Walker w;
  
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  uVar9 = pExpr->op;
  iVar13 = 2;
  switch(uVar9) {
  case '-':
    goto switchD_001924d7_caseD_2d;
  case '.':
  case '/':
  case '2':
  case '3':
  case ':':
    goto switchD_001924d7_caseD_2e;
  case '0':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    goto switchD_001924d7_caseD_30;
  case '1':
    break;
  case ';':
    local_100 = (pExpr->u).zToken;
    local_b0 = pParse->db;
    pExpr->iTable = -1;
    pcVar22 = (char *)0x0;
    pSVar35 = (Schema *)0x0;
    pcVar31 = (char *)0x0;
LAB_00192738:
    local_a8 = &pExpr->iTable;
    ppTVar30 = &pParse->pTriggerTab;
    local_109 = 0xa2;
    local_e0 = (SrcList_item *)0x0;
    local_a0 = 0;
    iVar13 = 0;
    local_b8 = pNC;
    do {
      pSVar4 = local_b8->pSrcList;
      if (pSVar4 == (SrcList *)0x0) {
        iVar12 = 0;
      }
      else {
        local_d0 = pSVar4->a;
        iVar12 = 0;
        for (iVar10 = 0; iVar10 < pSVar4->nSrc; iVar10 = iVar10 + 1) {
          pTVar24 = local_d0->pTab;
          pSVar3 = local_d0->pSelect;
          if ((pSVar3 == (Select *)0x0) || ((pSVar3->selFlags & 0x800) == 0)) {
LAB_0019287f:
            if ((pcVar31 == (char *)0x0) || (pTVar24->pSchema == pSVar35)) {
              if (pcVar22 != (char *)0x0) {
                pcVar37 = local_d0->zAlias;
                zLeft = pcVar37;
                if (pcVar37 == (char *)0x0) {
                  zLeft = pTVar24->zName;
                }
                iVar11 = sqlite3StrICmp(zLeft,pcVar22);
                if (iVar11 != 0) goto LAB_00192a04;
                if ((pcVar37 != (char *)0x0) && (1 < pParse->eParseMode)) {
                  sqlite3RenameTokenRemap(pParse,(void *)0x0,&pExpr->y);
                }
              }
              if (iVar13 == 0) {
                local_e0 = local_d0;
              }
              iVar13 = iVar13 + 1;
              pCVar32 = pTVar24->aCol;
              uVar36 = (uint)(ushort)pTVar24->nCol;
              uVar23 = 0;
              if (pTVar24->nCol < 1) {
                uVar36 = 0;
              }
              for (; uVar23 != uVar36; uVar23 = uVar23 + 1) {
                iVar11 = sqlite3StrICmp(pCVar32->zName,local_100);
                if (iVar11 == 0) {
                  if (iVar12 != 1) {
LAB_001929be:
                    iVar12 = iVar12 + 1;
                    if (uVar23 == (int)pTVar24->iPKey) {
                      uVar23 = 0xffff;
                    }
                    pExpr->iColumn = (ynVar)uVar23;
                    local_e0 = local_d0;
                    break;
                  }
                  if (((local_d0->fg).jointype & 4) == 0) {
                    pIVar5 = local_d0->pUsing;
                    if (pIVar5 == (IdList *)0x0) goto LAB_001929be;
                    uVar34 = pIVar5->nId;
                    if (pIVar5->nId < 1) {
                      uVar34 = 0;
                    }
                    lVar20 = 0;
                    do {
                      if ((ulong)uVar34 * 0x10 + 0x10 == lVar20 + 0x10) goto LAB_001929be;
                      iVar11 = sqlite3StrICmp(*(char **)((long)&pIVar5->a->zName + lVar20),local_100
                                             );
                      lVar20 = lVar20 + 0x10;
                    } while (iVar11 != 0);
                  }
                }
                pCVar32 = pCVar32 + 1;
              }
            }
          }
          else {
            uVar23 = pSVar3->pEList->nExpr;
            uVar28 = 0;
            uVar33 = (ulong)uVar23;
            if ((int)uVar23 < 1) {
              uVar33 = uVar28;
            }
            ppcVar29 = &pSVar3->pEList->a[0].zSpan;
            bVar41 = false;
            for (; uVar33 != uVar28; uVar28 = uVar28 + 1) {
              iVar11 = sqlite3MatchSpanName(*ppcVar29,local_100,pcVar22,pcVar31);
              if (iVar11 != 0) {
                iVar12 = iVar12 + 1;
                pExpr->iColumn = (ynVar)uVar28;
                local_e0 = local_d0;
                bVar41 = true;
                iVar13 = 2;
              }
              ppcVar29 = ppcVar29 + 4;
            }
            if (!bVar41 && pcVar22 != (char *)0x0) goto LAB_0019287f;
          }
LAB_00192a04:
          local_d0 = local_d0 + 1;
        }
        if (local_e0 == (SrcList_item *)0x0) {
          local_e0 = (SrcList_item *)0x0;
        }
        else {
          *local_a8 = local_e0->iCursor;
          pTVar24 = local_e0->pTab;
          (pExpr->y).pTab = pTVar24;
          if (((local_e0->fg).jointype & 8) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 0x10;
          }
          pSVar35 = pTVar24->pSchema;
        }
      }
      if (iVar13 == 0 && (pcVar22 != (char *)0x0 && pcVar31 == (char *)0x0)) {
        pTVar24 = *ppTVar30;
        if (pTVar24 == (Table *)0x0) {
          pTVar24 = (Table *)0x0;
        }
        else {
          uVar9 = pParse->eTriggerOp;
          if (uVar9 == 'y') {
LAB_00192abd:
            iVar10 = sqlite3StrICmp("old",pcVar22);
            iVar13 = 0;
            if (iVar10 == 0) {
LAB_00192ada:
              *local_a8 = iVar13;
              goto LAB_00192ae4;
            }
          }
          else {
            iVar10 = sqlite3StrICmp("new",pcVar22);
            iVar13 = 1;
            if (iVar10 == 0) goto LAB_00192ada;
            if (uVar9 != 'x') goto LAB_00192abd;
          }
          pTVar24 = (Table *)0x0;
        }
LAB_00192ae4:
        if ((((local_b8->ncFlags & 0x200) != 0) &&
            (pUVar6 = (local_b8->uNC).pUpsert, pUVar6 != (Upsert *)0x0)) &&
           (iVar13 = sqlite3StrICmp("excluded",pcVar22), iVar13 == 0)) {
          pTVar24 = pUVar6->pUpsertSrc->a[0].pTab;
          *local_a8 = 2;
        }
        if (pTVar24 == (Table *)0x0) {
          iVar13 = 0;
        }
        else {
          pCVar32 = pTVar24->aCol;
          pSVar35 = pTVar24->pSchema;
          uVar34 = (uint)pTVar24->nCol;
          uVar23 = 0;
          uVar36 = 0;
          if (0 < pTVar24->nCol) {
            uVar23 = 0;
            uVar36 = uVar34;
          }
          for (; uVar36 != uVar23; uVar23 = uVar23 + 1) {
            iVar13 = sqlite3StrICmp(pCVar32->zName,local_100);
            if (iVar13 == 0) {
              if ((int)pTVar24->iPKey == uVar23) {
                uVar23 = 0xffffffff;
              }
              uVar36 = uVar23;
              if ((int)uVar23 < (int)uVar34) goto LAB_00192bb7;
              break;
            }
            pCVar32 = pCVar32 + 1;
          }
          iVar13 = sqlite3IsRowid(local_100);
          if (iVar13 != 0) {
            uVar36 = uVar36 | -(uint)((pTVar24->tabFlags & 0x40) == 0);
          }
LAB_00192bb7:
          if ((int)uVar36 < (int)uVar34) {
            iVar12 = iVar12 + 1;
            if (*local_a8 == 2) {
              if (pParse->eParseMode < 2) {
                pExpr->iTable = uVar36 + ((local_b8->uNC).pUpsert)->regData;
                pbVar1 = (byte *)((long)&pExpr->flags + 2);
                *pbVar1 = *pbVar1 | 0x40;
                local_109 = 0xa8;
              }
              else {
                pExpr->iColumn = (ynVar)uVar36;
                (pExpr->y).pTab = pTVar24;
                local_109 = 0xa2;
              }
            }
            else {
              if ((int)uVar36 < 0) {
                pExpr->affinity = 'D';
              }
              else {
                uVar23 = 1 << ((byte)uVar36 & 0x1f);
                if (0x1f < uVar36) {
                  uVar23 = 0xffffffff;
                }
                if (*local_a8 == 0) {
                  pParse->oldmask = pParse->oldmask | uVar23;
                }
                else {
                  pParse->newmask = pParse->newmask | uVar23;
                }
              }
              (pExpr->y).pTab = pTVar24;
              pExpr->iColumn = (ynVar)uVar36;
              local_109 = 'M';
            }
          }
          iVar13 = 1;
        }
      }
      uVar23 = local_b8->ncFlags;
      if ((((iVar12 == 0) && (iVar13 == 1)) &&
          ((local_e0 != (SrcList_item *)0x0 &&
           ((iVar12 = 0, (uVar23 & 0x20) == 0 && (iVar10 = sqlite3IsRowid(local_100), iVar10 != 0)))
           ))) && ((local_e0->pTab->tabFlags & 0x40) == 0)) {
        pExpr->iColumn = -1;
        pExpr->affinity = 'D';
        iVar12 = 1;
      }
      if (((pcVar22 == (char *)0x0) && ((uVar23 & 0x80) != 0)) && (iVar12 == 0)) {
        pEVar17 = (local_b8->uNC).pEList;
        uVar36 = pEVar17->nExpr;
        if (pEVar17->nExpr < 1) {
          uVar36 = 0;
        }
        ppcVar29 = &pEVar17->a[0].zName;
        for (uVar33 = 0; uVar36 != uVar33; uVar33 = uVar33 + 1) {
          pcVar37 = *ppcVar29;
          if ((pcVar37 != (char *)0x0) && (iVar12 = sqlite3StrICmp(pcVar37,local_100), iVar12 == 0))
          {
            pEVar18 = ((ExprList_item *)(ppcVar29 + -1))->pExpr;
            if (((uVar23 & 1) == 0) && ((pEVar18->flags & 0x10) != 0)) {
              pcVar31 = "misuse of aliased aggregate %s";
            }
            else {
              if (((uVar23 >> 0xe & 1) != 0) || ((pEVar18->flags & 0x8000) == 0)) {
                iVar13 = sqlite3ExprVectorSize(pEVar18);
                if (iVar13 != 1) {
                  sqlite3ErrorMsg(pParse,"row value misused");
                  return 2;
                }
                resolveAlias(pParse,pEVar17,(int)uVar33,pExpr,"",local_a0);
                if (1 < pParse->eParseMode) {
                  sqlite3RenameTokenRemap(pParse,(void *)0x0,pExpr);
                }
                goto LAB_00193265;
              }
              pcVar31 = "misuse of aliased window function %s";
            }
            sqlite3ErrorMsg(pParse,pcVar31,pcVar37);
            return 2;
          }
          ppcVar29 = ppcVar29 + 4;
        }
      }
      else if (iVar12 != 0) {
        if (iVar12 == 1) {
          bVar41 = true;
          goto LAB_001931fb;
        }
        pcVar37 = "ambiguous column name";
        goto LAB_0019308c;
      }
      local_b8 = local_b8->pNext;
      local_a0 = local_a0 + 1;
    } while (local_b8 != (NameContext *)0x0);
    pcVar37 = "no such column";
    if (pcVar22 == (char *)0x0) {
      if ((pExpr->flags & 0x40) != 0) {
        if ((local_b0->init).busy != '\0') {
LAB_001937d7:
          sqlite3_log(0x1c,"double-quoted string literal: \"%w\"",local_100);
          pExpr->op = 'n';
          (pExpr->y).pTab = (Table *)0x0;
          return 1;
        }
        uVar23 = (uint)local_b0->flags;
        if ((pNC->ncFlags & 0x10000) == 0) {
          iVar13 = 0x1e;
        }
        else {
          if ((uVar23 & 0x50000001) == 0x40000001) goto LAB_001937d7;
          iVar13 = 0x1d;
        }
        if ((uVar23 >> iVar13 & 1) != 0) goto LAB_001937d7;
      }
      iVar13 = sqlite3ExprIdToTrueFalse(pExpr);
      if (iVar13 != 0) {
        return 1;
      }
    }
    local_b8 = (NameContext *)0x0;
LAB_0019308c:
    if (pcVar31 == (char *)0x0) {
      if (pcVar22 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar37,local_100);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar37,pcVar22,local_100);
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar37,pcVar31,pcVar22,local_100);
    }
    pParse->checkSchema = '\x01';
    pNC->nErr = pNC->nErr + 1;
    bVar41 = false;
LAB_001931fb:
    uVar2 = pExpr->iColumn;
    if ((-1 < (short)uVar2) && (local_e0 != (SrcList_item *)0x0)) {
      bVar19 = 0x3f;
      if (uVar2 < 0x3f) {
        bVar19 = (byte)uVar2;
      }
      local_e0->colUsed = local_e0->colUsed | 1L << (bVar19 & 0x3f);
    }
    sqlite3ExprDelete(local_b0,pExpr->pLeft);
    pExpr->pLeft = (Expr *)0x0;
    sqlite3ExprDelete(local_b0,pExpr->pRight);
    pExpr->pRight = (Expr *)0x0;
    pExpr->op = local_109;
    pbVar1 = (byte *)((long)&pExpr->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
    if (!bVar41) {
      return 2;
    }
LAB_00193265:
    if (((pExpr->flags & 0x400000) == 0) && (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
      pSVar4 = local_b8->pSrcList;
      iVar13 = sqlite3SchemaToIndex(pParse->db,pSVar35);
      if (-1 < iVar13) {
        if (pExpr->op != 'M') {
          uVar23 = pSVar4->nSrc;
          uVar33 = 0;
          if (0 < (int)uVar23) {
            uVar33 = (ulong)uVar23;
          }
          lVar20 = uVar33 + 1;
          ppTVar26 = (Table **)&pSVar4[-1].a[0].pSelect;
          do {
            lVar20 = lVar20 + -1;
            if (lVar20 == 0) goto LAB_00193332;
            ppTVar30 = ppTVar26 + 0xe;
            ppcVar29 = (char **)(ppTVar26 + 0x12);
            ppTVar26 = ppTVar30;
          } while (*local_a8 != *(int *)ppcVar29);
        }
        pTVar24 = *ppTVar30;
        if (pTVar24 != (Table *)0x0) {
          lVar20 = (long)pExpr->iColumn;
          if ((pExpr->iColumn < 0) && (lVar20 = (long)pTVar24->iPKey, lVar20 < 0)) {
            pcVar31 = "ROWID";
          }
          else {
            pcVar31 = pTVar24->aCol[lVar20].zName;
          }
          iVar13 = sqlite3AuthReadCol(pParse,(char *)pTVar24->zName,pcVar31,iVar13);
          if (iVar13 == 2) {
            pExpr->op = 'r';
          }
        }
      }
    }
LAB_00193332:
    for (; pNC->nRef = pNC->nRef + 1, pNC != local_b8; pNC = pNC->pNext) {
    }
    return 1;
  default:
    if ((uVar9 != '\x14') && (uVar9 != 0x83)) {
      if (uVar9 == 0x86) {
        pEVar18 = pExpr->pLeft;
        notValid(pParse,pNC,"the \".\" operator",0x20);
        pFrom = pExpr->pRight;
        if (pFrom->op == ';') {
          pcVar31 = (char *)0x0;
        }
        else {
          pcVar31 = (pEVar18->u).zToken;
          pEVar18 = pFrom->pLeft;
          pFrom = pFrom->pRight;
        }
        pcVar22 = (pEVar18->u).zToken;
        local_100 = (pFrom->u).zToken;
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenRemap(pParse,pExpr,pFrom);
          sqlite3RenameTokenRemap(pParse,&pExpr->y,pEVar18);
        }
        local_b0 = pParse->db;
        pExpr->iTable = -1;
        pSVar35 = (Schema *)0x0;
        if ((pcVar31 == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
          pcVar31 = (char *)0x0;
        }
        else {
          pSVar25 = (Schema *)(ulong)(uint)local_b0->nDb;
          if (local_b0->nDb < 1) {
            pSVar25 = pSVar35;
          }
          lVar20 = 0;
          do {
            lVar21 = lVar20;
            if ((long)pSVar25 * 0x20 + 0x20 == lVar21 + 0x20) {
              pSVar35 = (Schema *)0x0;
              goto LAB_00192738;
            }
            pDVar8 = local_b0->aDb;
            iVar13 = sqlite3StrICmp(*(char **)((long)&pDVar8->zDbSName + lVar21),pcVar31);
            lVar20 = lVar21 + 0x20;
          } while (iVar13 != 0);
          pSVar35 = *(Schema **)((long)&pDVar8->pSchema + lVar21);
        }
        goto LAB_00192738;
      }
      if (uVar9 == 0x94) {
        notValid(pParse,pNC,"parameters",0x26);
        goto switchD_001924d7_caseD_2e;
      }
      if (uVar9 == 0xa0) goto switchD_001924d7_caseD_2d;
      if (uVar9 != 0xa1) goto switchD_001924d7_caseD_2e;
      pSVar3 = (pExpr->x).pSelect;
      if (pSVar3 == (Select *)0x0) {
        iVar13 = 0;
      }
      else {
        iVar13 = *(int *)&pSVar3->pEList;
      }
      psVar7 = pParse->db;
      uVar9 = psVar7->enc;
      local_c8 = pNC->ncFlags & 0x4001;
      pcVar31 = (pExpr->u).zToken;
      iVar12 = sqlite3Strlen30(pcVar31);
      pFVar14 = sqlite3FindFunction(psVar7,pcVar31,iVar13,uVar9,'\0');
      if (pFVar14 == (FuncDef *)0x0) {
        bVar38 = false;
        pFVar14 = sqlite3FindFunction(pParse->db,pcVar31,-2,uVar9,'\0');
        bVar39 = pFVar14 == (FuncDef *)0x0;
        bVar41 = !bVar39;
      }
      else {
        bVar38 = pFVar14->xFinalize != (_func_void_sqlite3_context_ptr *)0x0;
        if ((pFVar14->funcFlags & 0x400) != 0) {
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 4;
          if (iVar13 == 2) {
            w.pParse = (Parse *)0xbff0000000000000;
            if ((char)pSVar3->pSrc->nSrc == -0x6f) {
              pSVar35 = pSVar3->pSrc->a[0].pSchema;
              iVar13 = sqlite3Strlen30((char *)pSVar35);
              sqlite3AtoF((char *)pSVar35,(double *)&w,iVar13,'\x01');
              if (1.0 < (double)w.pParse) goto LAB_00192ee3;
              pExpr->iTable = (int)((double)w.pParse * 134217728.0);
              if (-1 < (int)((double)w.pParse * 134217728.0)) goto LAB_00192fda;
            }
            else {
LAB_00192ee3:
              pExpr->iTable = -1;
            }
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNC->nErr = pNC->nErr + 1;
          }
          else {
            iVar13 = 0x7800000;
            if (*pFVar14->zName == 'u') {
              iVar13 = 0x800000;
            }
            pExpr->iTable = iVar13;
          }
        }
LAB_00192fda:
        iVar13 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFVar14->zName,(char *)0x0);
        if (iVar13 != 0) {
          if (iVar13 == 1) {
            sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFVar14->zName);
            pNC->nErr = pNC->nErr + 1;
          }
          pExpr->op = 'r';
          return 1;
        }
        uVar23 = pFVar14->funcFlags;
        if ((uVar23 & 0x2800) != 0) {
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 8;
        }
        if ((uVar23 >> 0xb & 1) == 0) {
          notValid(pParse,pNC,"non-deterministic functions",0x22);
          uVar23 = pFVar14->funcFlags;
        }
        bVar39 = true;
        if ((uVar23 >> 0x12 & 1) == 0) {
          bVar41 = true;
        }
        else {
          bVar40 = pParse->nested != '\0';
          bVar41 = sqlite3Config.bInternalFunctions != 0 || bVar40;
          if (sqlite3Config.bInternalFunctions == 0 && !bVar40) {
            pFVar14 = (FuncDef *)0x0;
          }
        }
      }
      bVar40 = bVar38;
      if (pParse->eParseMode < 2) {
        if (((pFVar14 == (FuncDef *)0x0) ||
            (pFVar14->xValue != (_func_void_sqlite3_context_ptr *)0x0)) ||
           ((pExpr->flags & 0x1000000) == 0)) {
          if (bVar38) {
            if ((pNC->ncFlags & 1U) != 0) {
              if ((pFVar14->funcFlags >> 0x10 & 1) == 0) {
                bVar40 = (pExpr->y).pTab != (Table *)0x0;
              }
              else {
                bVar40 = true;
                if ((pExpr->y).pTab == (Table *)0x0) goto LAB_00193398;
              }
              if (!bVar40 || ((uint)pNC->ncFlags >> 0xe & 1) != 0) goto LAB_001933c0;
            }
LAB_00193398:
            if ((pFVar14->funcFlags >> 0x10 & 1) == 0) {
              pcVar22 = "window";
              if ((pExpr->y).pTab == (Table *)0x0) {
                pcVar22 = "aggregate";
              }
            }
            else {
              pcVar22 = "window";
            }
            bVar40 = false;
            sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar22,iVar12,pcVar31);
            pNC->nErr = pNC->nErr + 1;
            goto LAB_00193461;
          }
LAB_001933c0:
          pcVar31 = "wrong number of arguments to function %.*s()";
          if (!bVar41) {
            bVar41 = (pParse->db->init).busy != '\0';
            if (!bVar41) {
              pcVar31 = "no such function: %.*s";
            }
            bVar39 = (bool)(bVar41 & bVar39);
          }
          if (!bVar39) goto LAB_001933f1;
        }
        else {
          pcVar31 = "%.*s() may not be used as a window function";
LAB_001933f1:
          sqlite3ErrorMsg(pParse,pcVar31,iVar12);
          pNC->nErr = pNC->nErr + 1;
        }
        bVar40 = false;
        if (bVar38) {
          pNC->ncFlags = pNC->ncFlags & -(uint)((pExpr->y).pTab == (Table *)0x0) - 0x4001;
          bVar40 = true;
        }
      }
LAB_00193461:
      sqlite3WalkExprList(pWalker,(ExprList *)pSVar3);
      if (!bVar40) {
        return 1;
      }
      pWVar15 = (pExpr->y).pWin;
      if (pWVar15 == (Window *)0x0) {
        pExpr->op = 0xa3;
        pExpr->op2 = '\0';
        for (pNVar27 = pNC; pNVar27 != (NameContext *)0x0; pNVar27 = pNVar27->pNext) {
          local_70 = pNVar27->pSrcList;
          w.xExprCallback = exprSrcCount;
          w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
          local_68 = 0;
          w.u.pNC = (NameContext *)&local_70;
          sqlite3WalkExprList(&w,(pExpr->x).pList);
          if ((0 < (int)local_68) || (local_68._4_4_ == 0)) {
            pNVar27->ncFlags = pFVar14->funcFlags & 0x1000 | pNVar27->ncFlags | 0x10;
            break;
          }
          pExpr->op2 = pExpr->op2 + '\x01';
        }
        goto LAB_00193645;
      }
      pSVar3 = pNC->pWinSelect;
      if (pParse->eParseMode < 2) {
        if ((pWVar15->zName == (char *)0x0) || (pWVar15->eFrmType != '\0')) {
          sqlite3WindowChain(pParse,pWVar15,pSVar3->pWinDefn);
          uVar9 = pWVar15->eFrmType;
        }
        else {
          pWVar16 = windowFind(pParse,pSVar3->pWinDefn,pWVar15->zName);
          if (pWVar16 == (Window *)0x0) goto LAB_001935da;
          pEVar17 = sqlite3ExprListDup(pParse->db,pWVar16->pPartition,0);
          pWVar15->pPartition = pEVar17;
          pEVar17 = sqlite3ExprListDup(pParse->db,pWVar16->pOrderBy,0);
          pWVar15->pOrderBy = pEVar17;
          pEVar18 = sqlite3ExprDup(pParse->db,pWVar16->pStart,0);
          pWVar15->pStart = pEVar18;
          pEVar18 = sqlite3ExprDup(pParse->db,pWVar16->pEnd,0);
          pWVar15->pEnd = pEVar18;
          pWVar15->eStart = pWVar16->eStart;
          pWVar15->eEnd = pWVar16->eEnd;
          uVar9 = pWVar16->eFrmType;
          pWVar15->eFrmType = uVar9;
          pWVar15->eExclude = pWVar16->eExclude;
        }
        if (((uVar9 == 'V') && ((pWVar15->pStart != (Expr *)0x0 || (pWVar15->pEnd != (Expr *)0x0))))
           && ((pWVar15->pOrderBy == (ExprList *)0x0 || (pWVar15->pOrderBy->nExpr != 1)))) {
          pcVar31 = "RANGE with offset PRECEDING/FOLLOWING requires one ORDER BY expression";
LAB_001935c6:
          sqlite3ErrorMsg(pParse,pcVar31);
        }
        else if ((pFVar14->funcFlags & 0x10000) != 0) {
          if (pWVar15->pFilter != (Expr *)0x0) {
            pcVar31 = "FILTER clause may only be used with aggregate window functions";
            goto LAB_001935c6;
          }
          psVar7 = pParse->db;
          lVar20 = 0;
          do {
            lVar21 = lVar20;
            if (lVar21 + 0x18 == 0xd8) goto LAB_001935d1;
            lVar20 = lVar21 + 0x18;
          } while (pFVar14->zName != *(char **)((long)&PTR_row_numberName_00203340 + lVar21));
          sqlite3ExprDelete(psVar7,pWVar15->pStart);
          sqlite3ExprDelete(psVar7,pWVar15->pEnd);
          pWVar15->pStart = (Expr *)0x0;
          pWVar15->pEnd = (Expr *)0x0;
          uVar9 = (&DAT_0020334c)[lVar21];
          pWVar15->eFrmType = (&DAT_00203348)[lVar21];
          pWVar15->eStart = uVar9;
          pWVar15->eEnd = (&DAT_00203350)[lVar21];
          pWVar15->eExclude = '\0';
          if (uVar9 == 'S') {
            pEVar18 = sqlite3Expr(psVar7,0x93,"1");
            pWVar15->pStart = pEVar18;
          }
        }
LAB_001935d1:
        pWVar15->pFunc = pFVar14;
      }
LAB_001935da:
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pPartition);
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
      sqlite3WalkExpr(pWalker,((pExpr->y).pWin)->pFilter);
      if (pSVar3->pWin == (Window *)0x0) {
        pWVar15 = (Window *)0x0;
LAB_0019362c:
        ((pExpr->y).pWin)->pNextWin = pWVar15;
        pSVar3->pWin = (Window *)pExpr->y;
      }
      else {
        iVar13 = sqlite3WindowCompare(pParse,pSVar3->pWin,(pExpr->y).pWin);
        if (iVar13 == 0) {
          pWVar15 = pSVar3->pWin;
          goto LAB_0019362c;
        }
      }
      pbVar1 = (byte *)((long)&pNC->ncFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
LAB_00193645:
      pNC->ncFlags = pNC->ncFlags | local_c8;
      return 1;
    }
  }
  if ((pExpr->flags & 0x800) != 0) {
    iVar12 = pNC->nRef;
    notValid(pParse,pNC,"subqueries",0x26);
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar12 != pNC->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 0x40;
    }
  }
  goto switchD_001924d7_caseD_2e;
switchD_001924d7_caseD_2d:
  pEVar18 = sqlite3ExprSkipCollate(pExpr->pRight);
  if (pEVar18->op == ';') {
    iVar12 = resolveExprStep(pWalker,pEVar18);
    if (iVar12 == 2) {
      return 2;
    }
    if (pEVar18->op == 0x9f) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa7;
      return 0;
    }
  }
switchD_001924d7_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_001924d7_caseD_2e;
  iVar12 = sqlite3ExprVectorSize(pExpr->pLeft);
  if (pExpr->op == '0') {
    pEVar17 = (pExpr->x).pList;
    iVar10 = sqlite3ExprVectorSize(pEVar17->a[0].pExpr);
    if (iVar10 == iVar12) {
      pEVar17 = pEVar17 + 1;
      goto LAB_00192612;
    }
  }
  else {
    pEVar17 = (ExprList *)&pExpr->pRight;
LAB_00192612:
    iVar10 = sqlite3ExprVectorSize(*(Expr **)pEVar17);
  }
  if (iVar12 != iVar10) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_001924d7_caseD_2e:
  if (pParse->nErr == 0) {
    iVar13 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar13;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */
      int savedAllowFlags = (pNC->ncFlags & (NC_AllowAgg | NC_AllowWin));

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
          /* Window functions may not be arguments of aggregate functions.
          ** Or arguments of other window functions. But aggregate functions
          ** may be arguments for window functions.  */
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(NC_AllowWin | (!pExpr->y.pWin ? NC_AllowAgg : 0));
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          if( IN_RENAME_OBJECT==0 ){
            sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          }
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_HasWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
        }
        pNC->ncFlags |= savedAllowFlags;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( pRight->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}